

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset_test.c
# Opt level: O1

long test_callback_func(void *cb_data,float **data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (data == (float **)0x0 || cb_data == (void *)0x0) {
    return 0;
  }
  lVar1 = *(long *)((long)cb_data + 8);
  lVar3 = *(long *)((long)cb_data + 0x10) - lVar1;
  lVar2 = 0;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  *data = (float *)(lVar1 * 4 + *(long *)((long)cb_data + 0x18));
  *(long *)((long)cb_data + 8) = lVar1 + lVar2;
  return lVar2;
}

Assistant:

static long
test_callback_func (void *cb_data, float **data)
{	TEST_CB_DATA *pcb_data ;

	long frames ;

	if ((pcb_data = cb_data) == NULL)
		return 0 ;

	if (data == NULL)
		return 0 ;

	if (pcb_data->total - pcb_data->count > 0)
		frames = pcb_data->total - pcb_data->count ;
	else
		frames = 0 ;

	*data = pcb_data->data + pcb_data->count ;
	pcb_data->count += frames ;

	return frames ;
}